

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

CURLcode get_url_file_name(char **filename,char *url)

{
  char *pcVar1;
  char *pc2;
  char *pc;
  char *url_local;
  char **filename_local;
  
  *filename = (char *)0x0;
  pcVar1 = strstr(url,"://");
  pc2 = url;
  if (pcVar1 != (char *)0x0) {
    pc2 = pcVar1 + 3;
  }
  pcVar1 = strrchr(pc2,0x5c);
  pc2 = strrchr(pc2,0x2f);
  if ((pcVar1 != (char *)0x0) && ((pc2 == (char *)0x0 || (pc2 < pcVar1)))) {
    pc2 = pcVar1;
  }
  if (pc2 == (char *)0x0) {
    pc2 = "";
  }
  else {
    pc2 = pc2 + 1;
  }
  pcVar1 = strdup(pc2);
  *filename = pcVar1;
  if (*filename == (char *)0x0) {
    filename_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    filename_local._4_4_ = CURLE_OK;
  }
  return filename_local._4_4_;
}

Assistant:

CURLcode get_url_file_name(char **filename, const char *url)
{
  const char *pc, *pc2;

  *filename = NULL;

  /* Find and get the remote file name */
  pc = strstr(url, "://");
  if(pc)
    pc += 3;
  else
    pc = url;

  pc2 = strrchr(pc, '\\');
  pc = strrchr(pc, '/');
  if(pc2 && (!pc || pc < pc2))
    pc = pc2;

  if(pc)
    /* duplicate the string beyond the slash */
    pc++;
  else
    /* no slash => empty string */
    pc = "";

  *filename = strdup(pc);
  if(!*filename)
    return CURLE_OUT_OF_MEMORY;

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, *filename, 0);
    Curl_safefree(*filename);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *filename = sanitized;
  }
#endif /* MSDOS || WIN32 */

  /* in case we built debug enabled, we allow an environment variable
   * named CURL_TESTDIR to prefix the given file name to put it into a
   * specific directory
   */
#ifdef DEBUGBUILD
  {
    char *tdir = curlx_getenv("CURL_TESTDIR");
    if(tdir) {
      char buffer[512]; /* suitably large */
      snprintf(buffer, sizeof(buffer), "%s/%s", tdir, *filename);
      Curl_safefree(*filename);
      *filename = strdup(buffer); /* clone the buffer */
      curl_free(tdir);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;
    }
  }
#endif

  return CURLE_OK;
}